

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimpleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SimpleDirectiveSyntax *pSVar6;
  
  pSVar6 = (SimpleDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleDirectiveSyntax *)this->endPtr < pSVar6 + 1) {
    pSVar6 = (SimpleDirectiveSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pSVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pSVar6->super_DirectiveSyntax).super_SyntaxNode.kind = *args;
  (pSVar6->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar6->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar6->super_DirectiveSyntax).directive.kind = TVar2;
  (pSVar6->super_DirectiveSyntax).directive.field_0x2 = uVar3;
  (pSVar6->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar4.raw;
  (pSVar6->super_DirectiveSyntax).directive.rawLen = uVar5;
  (pSVar6->super_DirectiveSyntax).directive.info = pIVar1;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }